

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall
QList<QToolBarAreaLayoutItem>::removeAt(QList<QToolBarAreaLayoutItem> *this,qsizetype i)

{
  Data *pDVar1;
  
  pDVar1 = (this->d).d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QArrayDataPointer<QToolBarAreaLayoutItem>::reallocateAndGrow
              (&this->d,GrowsAtEnd,0,(QArrayDataPointer<QToolBarAreaLayoutItem> *)0x0);
  }
  QtPrivate::QPodArrayOps<QToolBarAreaLayoutItem>::erase
            ((QPodArrayOps<QToolBarAreaLayoutItem> *)this,(this->d).ptr + i,1);
  return;
}

Assistant:

void removeAt(qsizetype i) { remove(i); }